

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<6UL>::SimpleTypeHandler
          (SimpleTypeHandler<6UL> *this,PropertyRecord *id,byte param_3,byte param_4,uint16 param_5,
          uint16 param_6)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimplePropertyDescriptor *local_30;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  PropertyTypes propertyTypes_local;
  PropertyAttributes attributes_local;
  PropertyRecord *id_local;
  SimpleTypeHandler<6UL> *this_local;
  
  DynamicTypeHandler::DynamicTypeHandler(&this->super_DynamicTypeHandler,6,param_5,param_6,'\x1d');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e4df68
  ;
  this->propertyCount = 1;
  local_30 = this->descriptors;
  do {
    SimplePropertyDescriptor::SimplePropertyDescriptor(local_30);
    local_30 = local_30 + 1;
  } while ((SimpleTypeHandler<6UL> *)local_30 != this + 1);
  if ((param_3 & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x32,"((attributes & 0x08) == 0)",
                                "(attributes & PropertyDeleted) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::NoWriteBarrierSet<Js::PropertyRecord_const>(&this->descriptors[0].Id,id);
  this->descriptors[0].field_1.Attributes = param_3;
  if ((param_4 & 0x60) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x36,
                                "((propertyTypes & ((0x80|0x10|0x20|0x40) & ~(0x10 | 0x80))) == 0)",
                                "(propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DynamicTypeHandler::SetPropertyTypes(&this->super_DynamicTypeHandler,0x90,param_4);
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(NO_WRITE_BARRIER_TAG_TYPE(const PropertyRecord* id), PropertyAttributes attributes, PropertyTypes propertyTypes, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots) :
        DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
        inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag), propertyCount(1)
    {
        Assert((attributes & PropertyDeleted) == 0);
        NoWriteBarrierSet(descriptors[0].Id, id); // Used to init from global static BuiltInPropertyId
        descriptors[0].Attributes = attributes;

        Assert((propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0);
        SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties, propertyTypes);
        SetIsInlineSlotCapacityLocked();
    }